

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_display_driver.cpp
# Opt level: O2

void __thiscall MdDisplayDriver::display(MdDisplayDriver *this,Document *doc,ostream *output)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int local_84;
  string local_50 [32];
  
  local_84 = 1;
  uVar14 = 0;
  do {
    uVar4 = Document::size();
    if (uVar4 <= uVar14) {
      return;
    }
    plVar5 = (long *)Document::operator[]((ulong)doc);
    uVar2 = (**(code **)(*plVar5 + 8))();
    switch(uVar2) {
    case 1:
      pcVar13 = "# ";
      break;
    case 2:
      pcVar13 = "## ";
      break;
    case 3:
      pcVar13 = "### ";
      break;
    case 7:
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)output,local_84);
      std::operator<<(poVar12,") ");
      local_84 = local_84 + 1;
    default:
      goto LAB_0012c166;
    case 8:
      pcVar13 = "* ";
      break;
    case 9:
      pcVar13 = "  * ";
      break;
    case 10:
      pcVar13 = "> ";
      break;
    case 0xb:
      pcVar13 = "    ";
    }
    std::operator<<(output,pcVar13);
LAB_0012c166:
    for (uVar4 = 0; uVar6 = Paragraph::size(), uVar4 < uVar6; uVar4 = uVar4 + 1) {
      plVar7 = (long *)Paragraph::operator[]((ulong)plVar5);
      if (plVar7 == (long *)0x0) {
        bVar1 = true;
        lVar9 = 0;
        bVar17 = true;
        bVar15 = true;
      }
      else {
        lVar8 = __dynamic_cast(plVar7,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
        lVar9 = __dynamic_cast(plVar7,&LineElement::typeinfo,&UrlLineElement::typeinfo);
        lVar10 = __dynamic_cast(plVar7,&LineElement::typeinfo,&BoldLineElement::typeinfo);
        bVar15 = lVar10 == 0;
        lVar11 = __dynamic_cast(plVar7,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
        bVar16 = lVar11 == 0;
        bVar17 = lVar8 == 0;
        if ((bVar17) || (iVar3 = (**(code **)(*plVar5 + 8))(), iVar3 == 0xb)) {
          if (lVar9 == 0) {
            if (lVar10 == 0) {
              bVar15 = true;
              pcVar13 = "*";
              lVar9 = 0;
              bVar1 = true;
              bVar16 = false;
              if (lVar11 == 0) goto LAB_0012c281;
            }
            else {
              lVar9 = 0;
              pcVar13 = "**";
              bVar15 = false;
            }
          }
          else {
            pcVar13 = "[";
          }
        }
        else {
          bVar17 = false;
          pcVar13 = "`";
        }
        bVar1 = bVar16;
        std::operator<<(output,pcVar13);
      }
LAB_0012c281:
      (**(code **)(*plVar7 + 0x10))(local_50,plVar7);
      std::operator<<(output,local_50);
      std::__cxx11::string::~string(local_50);
      if ((bVar17) || (iVar3 = (**(code **)(*plVar5 + 8))(plVar5), iVar3 == 0xb)) {
        if (lVar9 == 0) {
          if (bVar15) {
            if (bVar1) goto LAB_0012c335;
            pcVar13 = "*";
          }
          else {
            pcVar13 = "**";
          }
          goto LAB_0012c330;
        }
        poVar12 = std::operator<<(output,"](");
        UrlLineElement::url_abi_cxx11_();
        poVar12 = std::operator<<(poVar12,local_50);
        std::operator<<(poVar12,")");
        std::__cxx11::string::~string(local_50);
      }
      else {
        pcVar13 = "`";
LAB_0012c330:
        std::operator<<(output,pcVar13);
      }
LAB_0012c335:
    }
    iVar3 = (**(code **)(*plVar5 + 8))(plVar5);
    if (iVar3 != 7) {
      local_84 = 1;
    }
    poVar12 = std::endl<char,std::char_traits<char>>(output);
    std::endl<char,std::char_traits<char>>(poVar12);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void MdDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);

	int olist1_index(1);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "# ";
				break;
			case Paragraph::Level::Title2:
				output << "## ";
				break;
			case Paragraph::Level::Title3:
				output << "### ";
				break;
			case Paragraph::Level::UList1:
				output << "* ";
				break;
			case Paragraph::Level::UList2:
				output << "  * ";
				break;
			case Paragraph::Level::OList1:
				output << olist1_index << ") ";
				++olist1_index;
				break;
			case Paragraph::Level::Quote:
				output << "> ";
				break;
			case Paragraph::Level::Code:
				output << "    ";
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "[";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "](" << url_le->url() << ")";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		if (p->level() != Paragraph::Level::OList1) {
			olist1_index = 1;
		}

		output << endl << endl;
	}
}